

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O3

bool __thiscall
jrtplib::RTCPSDESInfo::GetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  
  p_Var1 = (this->privitems).
           super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    bVar2 = p_Var1 != (_List_node_base *)&this->privitems;
    if (!bVar2) {
      return bVar2;
    }
    if ((*(_List_node_base **)((long)(p_Var1[1]._M_next + 2) + 8) == (_List_node_base *)prefixlen)
       && ((prefixlen == 0 ||
           (iVar3 = bcmp(prefix,p_Var1[1]._M_next[2]._M_next,prefixlen), iVar3 == 0)))) break;
    p_Var1 = p_Var1->_M_next;
  }
  p_Var1 = p_Var1[1]._M_next;
  *valuelen = (size_t)*(_List_node_base **)((long)(p_Var1 + 1) + 8);
  *value = (uint8_t *)p_Var1[1]._M_next;
  return bVar2;
}

Assistant:

bool RTCPSDESInfo::GetPrivateValue(const uint8_t *prefix,size_t prefixlen,uint8_t **value,size_t *valuelen) const
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (found)
		*value = (*it)->GetInfo(valuelen);
	return found;
}